

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

void long_help(void)

{
  int iVar1;
  char *__s1;
  char *pcVar2;
  char *local_18;
  char *p;
  char *prog;
  
  __s1 = lafe_getprogname();
  fflush(_stderr);
  iVar1 = strcmp(__s1,"bsdcpio");
  pcVar2 = "";
  if (iVar1 != 0) {
    pcVar2 = "(bsdcpio)";
  }
  printf("%s%s: manipulate archive files\n",__s1,pcVar2);
  for (local_18 = long_help_msg; *local_18 != '\0'; local_18 = local_18 + 1) {
    if (*local_18 == '%') {
      if (local_18[1] == 'p') {
        fputs(__s1,_stdout);
        local_18 = local_18 + 1;
      }
      else {
        putchar(0x25);
      }
    }
    else {
      putchar((int)*local_18);
    }
  }
  version();
}

Assistant:

static void
long_help(void)
{
	const char	*prog;
	const char	*p;

	prog = lafe_getprogname();

	fflush(stderr);

	p = (strcmp(prog,"bsdcpio") != 0) ? "(bsdcpio)" : "";
	printf("%s%s: manipulate archive files\n", prog, p);

	for (p = long_help_msg; *p != '\0'; p++) {
		if (*p == '%') {
			if (p[1] == 'p') {
				fputs(prog, stdout);
				p++;
			} else
				putchar('%');
		} else
			putchar(*p);
	}
	version();
}